

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_distances.cc
# Opt level: O3

S2Point * S2::InterpolateAtDistance
                    (S2Point *__return_storage_ptr__,S1Angle ax_angle,S2Point *a,S2Point *b)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  bool bVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  Vector3_d normal;
  double local_88 [4];
  double local_68 [4];
  Vector3_d local_48;
  S2LogMessage local_30;
  
  bVar4 = IsUnitLength(a);
  if (bVar4) {
    bVar4 = IsUnitLength(b);
    if (bVar4) {
      RobustCrossProd(&local_48,a,b);
      dVar10 = a->c_[2] * local_48.c_[1] - local_48.c_[2] * a->c_[1];
      dVar11 = a->c_[0] * local_48.c_[2] - local_48.c_[0] * a->c_[2];
      dVar9 = a->c_[1] * local_48.c_[0] - local_48.c_[1] * a->c_[0];
      local_68[0] = dVar10;
      local_68[1] = dVar11;
      local_68[2] = dVar9;
      local_88[0] = 0.0;
      local_88[1] = 0.0;
      local_88[2] = 0.0;
      lVar5 = 0;
      do {
        dVar1 = *(double *)((long)local_68 + lVar5);
        dVar8 = *(double *)((long)local_88 + lVar5);
        if ((dVar1 != dVar8) || (NAN(dVar1) || NAN(dVar8))) break;
        bVar4 = lVar5 != 0x10;
        lVar5 = lVar5 + 8;
      } while (bVar4);
      if ((dVar1 != dVar8) || (NAN(dVar1) || NAN(dVar8))) {
        dVar6 = cos(ax_angle.radians_);
        dVar8 = a->c_[0];
        dVar3 = a->c_[1];
        dVar1 = a->c_[2];
        dVar7 = sin(ax_angle.radians_);
        dVar7 = dVar7 / SQRT(dVar9 * dVar9 + dVar11 * dVar11 + dVar10 * dVar10);
        dVar8 = dVar7 * dVar10 + dVar6 * dVar8;
        dVar11 = dVar7 * dVar11 + dVar6 * dVar3;
        dVar10 = dVar7 * dVar9 + dVar1 * dVar6;
        dVar9 = SQRT(dVar10 * dVar10 + dVar11 * dVar11 + dVar8 * dVar8);
        dVar9 = (double)(~-(ulong)(dVar9 != 0.0) & (ulong)dVar9 |
                        (ulong)(1.0 / dVar9) & -(ulong)(dVar9 != 0.0));
        auVar2._8_4_ = SUB84(dVar9 * dVar11,0);
        auVar2._0_8_ = dVar9 * dVar8;
        auVar2._12_4_ = (int)((ulong)(dVar9 * dVar11) >> 0x20);
        *(undefined1 (*) [16])__return_storage_ptr__->c_ = auVar2;
        __return_storage_ptr__->c_[2] = dVar9 * dVar10;
        return __return_storage_ptr__;
      }
      S2LogMessage::S2LogMessage
                (&local_30,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
                 ,0x36,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_30.stream_,"Check failed: tangent != S2Point(0, 0, 0) ",0x2a);
    }
    else {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
                 ,0x2f,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_48.c_[1],"Check failed: S2::IsUnitLength(b) ",0x22);
    }
  }
  else {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
               ,0x2e,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_48.c_[1],"Check failed: S2::IsUnitLength(a) ",0x22);
  }
  abort();
}

Assistant:

S2Point InterpolateAtDistance(S1Angle ax_angle,
                              const S2Point& a, const S2Point& b) {
  double ax = ax_angle.radians();

  S2_DCHECK(S2::IsUnitLength(a));
  S2_DCHECK(S2::IsUnitLength(b));

  // Use RobustCrossProd() to compute the tangent vector at A towards B.  The
  // result is always perpendicular to A, even if A=B or A=-B, but it is not
  // necessarily unit length.  (We effectively normalize it below.)
  Vector3_d normal = S2::RobustCrossProd(a, b);
  Vector3_d tangent = normal.CrossProd(a);
  S2_DCHECK(tangent != S2Point(0, 0, 0));

  // Now compute the appropriate linear combination of A and "tangent".  With
  // infinite precision the result would always be unit length, but we
  // normalize it anyway to ensure that the error is within acceptable bounds.
  // (Otherwise errors can build up when the result of one interpolation is
  // fed into another interpolation.)
  return (cos(ax) * a + (sin(ax) / tangent.Norm()) * tangent).Normalize();
}